

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++:264:7)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_async_io_test_c__:264:7)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  bool bVar1;
  __pid_t _Var2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char buf [4];
  Array<char> local_50;
  uint local_34;
  unsigned_long local_30;
  
  (**(params_1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_50,&params_1->super_AsyncOutputStream,"foo",3);
  Promise<void>::wait((Promise<void> *)&local_50,params_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_50);
  (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_50,params_1,buf,3,4);
  _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_50,params_2);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_50);
  if ((CONCAT44(extraout_var,_Var2) != 3) && (_::Debug::minSeverity < 3)) {
    local_34 = 3;
    (*(params_1->super_AsyncInputStream)._vptr_AsyncInputStream[1])(&local_50,params_1,buf,3,4);
    _Var2 = Promise<unsigned_long>::wait((Promise<unsigned_long> *)&local_50,params_2);
    local_30 = CONCAT44(extraout_var_00,_Var2);
    _::Debug::log<char_const(&)[69],unsigned_int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x10b,ERROR,
               "\"failed: expected \" \"(3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))\", 3u, stream.tryRead(buf, 3, 4).wait(waitScope)"
               ,(char (*) [69])
                "failed: expected (3u) == (stream.tryRead(buf, 3, 4).wait(waitScope))",&local_34,
               &local_30);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_50);
  }
  heapString((String *)&local_50,buf,3);
  bVar1 = operator==("bar",(String *)&local_50);
  Array<char>::~Array(&local_50);
  if (!bVar1 && _::Debug::minSeverity < 3) {
    heapString((String *)&local_50,buf,3);
    _::Debug::log<char_const(&)[49],char_const(&)[4],kj::String>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-test.c++"
               ,0x10c,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (heapString(buf, 3))\", \"bar\", heapString(buf, 3)"
               ,(char (*) [49])"failed: expected (\"bar\") == (heapString(buf, 3))",
               (char (*) [4])0x33b5a1,(String *)&local_50);
    Array<char>::~Array(&local_50);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }